

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

void __thiscall re2::PCRE::PCRE(PCRE *this,string *pattern,PCRE_Options *re_option)

{
  (this->pattern_)._M_dataplus._M_p = (pointer)&(this->pattern_).field_2;
  (this->pattern_)._M_string_length = 0;
  (this->pattern_).field_2._M_local_buf[0] = '\0';
  Init(this,(pattern->_M_dataplus)._M_p,re_option->option_,re_option->match_limit_,
       re_option->stack_limit_,re_option->report_errors_);
  return;
}

Assistant:

PCRE::PCRE(const string& pattern, const PCRE_Options& re_option) {
  Init(pattern.c_str(), re_option.option(), re_option.match_limit(),
       re_option.stack_limit(), re_option.report_errors());
}